

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O2

Vec3<float> * Imath_3_2::operator*=(Vec3<float> *v,Matrix44<float> *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  
  fVar1 = v->x;
  fVar2 = v->y;
  fVar3 = v->z;
  fVar4 = m->x[1][2];
  fVar5 = m->x[0][2];
  fVar6 = m->x[2][2];
  fVar7 = m->x[3][2];
  fVar14 = m->x[2][3] * fVar3 + m->x[0][3] * fVar1 + m->x[1][3] * fVar2 + m->x[3][3];
  uVar8 = *(undefined8 *)m->x[0];
  uVar9 = *(undefined8 *)m->x[1];
  uVar10 = *(undefined8 *)m->x[2];
  uVar11 = *(undefined8 *)m->x[3];
  auVar12._0_4_ =
       fVar3 * (float)uVar10 + fVar1 * (float)uVar8 + (float)uVar9 * fVar2 + (float)uVar11;
  auVar12._4_4_ =
       fVar3 * (float)((ulong)uVar10 >> 0x20) +
       fVar1 * (float)((ulong)uVar8 >> 0x20) + (float)((ulong)uVar9 >> 0x20) * fVar2 +
       (float)((ulong)uVar11 >> 0x20);
  auVar12._8_4_ = fVar1 * 0.0 + fVar2 * 0.0 + 0.0 + 0.0;
  auVar12._12_4_ = fVar1 * 0.0 + fVar2 * 0.0 + 0.0 + 0.0;
  auVar13._4_4_ = fVar14;
  auVar13._0_4_ = fVar14;
  auVar13._8_8_ = 0;
  auVar13 = divps(auVar12,auVar13);
  v->x = (float)(int)auVar13._0_8_;
  v->y = (float)(int)((ulong)auVar13._0_8_ >> 0x20);
  v->z = (fVar6 * fVar3 + fVar5 * fVar1 + fVar4 * fVar2 + fVar7) / fVar14;
  return v;
}

Assistant:

IMATH_HOSTDEVICE inline const Vec3<S>&
operator*= (Vec3<S>& v, const Matrix44<T>& m) IMATH_NOEXCEPT
{
    S x = S (v.x * m.x[0][0] + v.y * m.x[1][0] + v.z * m.x[2][0] + m.x[3][0]);
    S y = S (v.x * m.x[0][1] + v.y * m.x[1][1] + v.z * m.x[2][1] + m.x[3][1]);
    S z = S (v.x * m.x[0][2] + v.y * m.x[1][2] + v.z * m.x[2][2] + m.x[3][2]);
    S w = S (v.x * m.x[0][3] + v.y * m.x[1][3] + v.z * m.x[2][3] + m.x[3][3]);

    v.x = x / w;
    v.y = y / w;
    v.z = z / w;

    return v;
}